

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O3

void __thiscall miniros::Publication::peerConnect(Publication *this,SubscriberLinkPtr *sub_link)

{
  pointer psVar1;
  element_type *__args;
  CallbackQueueInterface *pCVar2;
  int iVar3;
  pointer psVar4;
  undefined1 local_61;
  pthread_mutex_t *local_60;
  undefined8 local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_60 = (pthread_mutex_t *)&this->callbacks_mutex_;
  iVar3 = pthread_mutex_lock(local_60);
  if (iVar3 == 0) {
    psVar4 = (this->callbacks_).
             super__Vector_base<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->callbacks_).
             super__Vector_base<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar4 != psVar1) {
      do {
        __args = (psVar4->
                 super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if ((*(_Manager_type *)(&(__args->connect_).super__Function_base._M_functor + 1) !=
             (_Manager_type)0x0) && (__args->callback_queue_ != (CallbackQueueInterface *)0x0)) {
          local_58 = (PeerConnDisconnCallback *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<miniros::PeerConnDisconnCallback,std::allocator<miniros::PeerConnDisconnCallback>,std::function<void(miniros::SingleSubscriberPublisher_const&)>&,std::shared_ptr<miniros::SubscriberLink>const&,bool&,std::weak_ptr<void_const>&>
                    (&_Stack_50,(PeerConnDisconnCallback **)&local_58,
                     (allocator<miniros::PeerConnDisconnCallback> *)&local_61,&__args->connect_,
                     sub_link,&__args->has_tracked_object_,&__args->tracked_object_);
          local_48 = (undefined4)local_58;
          uStack_44 = local_58._4_4_;
          uStack_40 = _Stack_50._M_pi._0_4_;
          uStack_3c = _Stack_50._M_pi._4_4_;
          pCVar2 = ((psVar4->
                    super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->callback_queue_;
          (*pCVar2->_vptr_CallbackQueueInterface[2])(pCVar2,&local_48);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_3c,uStack_40) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_3c,uStack_40)
                      );
          }
        }
        psVar4 = psVar4 + 1;
      } while (psVar4 != psVar1);
    }
    pthread_mutex_unlock(local_60);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void Publication::peerConnect(const SubscriberLinkPtr& sub_link)
{
  std::scoped_lock<std::mutex> lock(callbacks_mutex_);

  V_Callback::iterator it = callbacks_.begin();
  V_Callback::iterator end = callbacks_.end();
  for (; it != end; ++it)
  {
    const SubscriberCallbacksPtr& cbs = *it;
    if (cbs->connect_ && cbs->callback_queue_)
    {
      CallbackInterfacePtr cb(std::make_shared<PeerConnDisconnCallback>(cbs->connect_, sub_link, cbs->has_tracked_object_, cbs->tracked_object_));
      cbs->callback_queue_->addCallback(cb, (uint64_t)cbs.get());
    }
  }
}